

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
duckdb_fmt::v6::
format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_format_specs(format_handler<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>_>,_char,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                  *this,char *begin,char *end)

{
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *pbVar1;
  size_t *psVar2;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *pbVar3;
  char *pcVar4;
  bool bVar5;
  char *pcVar6;
  iterator iVar7;
  custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  f;
  basic_format_specs<char> specs;
  string local_c8;
  custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  local_a8;
  arg_formatter<duckdb_fmt::v6::buffer_range<char>_> local_98;
  basic_format_specs<char> local_6c;
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  local_58;
  
  pbVar1 = &this->parse_context;
  pcVar6 = (this->parse_context).format_str_.data_;
  (this->parse_context).format_str_.data_ = begin;
  psVar2 = &(this->parse_context).format_str_.size_;
  *psVar2 = (size_t)(pcVar6 + (*psVar2 - (long)begin));
  pbVar3 = &this->context;
  local_a8.parse_ctx_ = pbVar1;
  local_a8.ctx_ = pbVar3;
  bVar5 = visit_format_arg<duckdb_fmt::v6::internal::custom_formatter<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>&,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    (&local_a8,&this->arg);
  if (bVar5) {
    pcVar6 = (pbVar1->format_str_).data_;
  }
  else {
    local_6c.width = 0;
    local_6c.precision = -1;
    local_6c.type = '\0';
    local_6c._9_1_ = 0;
    local_6c.fill.data_[4] = '\0';
    local_6c.fill.data_[5] = '\0';
    local_6c.fill.data_[0] = ' ';
    local_6c.fill.data_[1] = '\0';
    local_6c.fill.data_[2] = '\0';
    local_6c.fill.data_[3] = '\0';
    local_6c.thousands = '\0';
    local_58.checker_.arg_type_ = (this->arg).type_;
    local_58.checker_.error_handler_ =
         &local_58.
          super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ;
    local_58.
    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    .super_specs_setter<char>.specs_ = &local_6c;
    local_58.
    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    .parse_context_ = pbVar1;
    local_58.
    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    .context_ = pbVar3;
    pcVar6 = internal::
             parse_format_specs<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                       (begin,end,
                        (specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                         *)local_58.checker_.error_handler_);
    if ((pcVar6 == end) || (*pcVar6 != '}')) {
      std::__cxx11::string::string
                ((string *)&local_c8,"missing \'}\' in format string",(allocator *)&local_98);
      internal::error_handler::on_error((error_handler *)this,&local_c8);
    }
    pcVar4 = (this->parse_context).format_str_.data_;
    (this->parse_context).format_str_.data_ = pcVar6;
    psVar2 = &(this->parse_context).format_str_.size_;
    *psVar2 = (size_t)(pcVar4 + (*psVar2 - (long)pcVar6));
    local_98.
    super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    .writer_.out_.container = (this->context).out_.container;
    local_98.
    super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    .writer_.locale_.locale_ = (this->context).loc_.locale_;
    local_98.
    super_arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
    .specs_ = &local_6c;
    local_98.ctx_ = pbVar3;
    local_98.parse_ctx_ = pbVar1;
    iVar7 = visit_format_arg<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                      (&local_98,&this->arg);
    (this->context).out_.container = iVar7.container;
  }
  return pcVar6;
}

Assistant:

const Char* on_format_specs(const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    internal::custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    using parse_context_t = basic_format_parse_context<Char>;
    internal::specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }